

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void ppc_tlb_invalidate_all_ppc64(CPUPPCState_conflict2 *env)

{
  CPUState *pCVar1;
  CPUPPCState_conflict2 *env_local;
  
  if ((env->mmu_model & 0x10000) == POWERPC_MMU_UNKNOWN) {
    switch(env->mmu_model) {
    case POWERPC_MMU_32B:
    case POWERPC_MMU_601:
      env->tlb_need_flush = 0;
      pCVar1 = env_cpu(env);
      tlb_flush_ppc64(pCVar1);
      break;
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
      ppc6xx_tlb_invalidate_all(env);
      break;
    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_SOFT_4xx_Z:
      ppc4xx_tlb_invalidate_all(env);
      break;
    case POWERPC_MMU_REAL:
      pCVar1 = env_cpu(env);
      cpu_abort_ppc64(pCVar1,"No TLB for PowerPC 4xx in real mode\n");
    case POWERPC_MMU_MPC8xx:
      pCVar1 = env_cpu(env);
      cpu_abort_ppc64(pCVar1,"MPC8xx MMU model is not implemented\n");
    case POWERPC_MMU_BOOKE:
      pCVar1 = env_cpu(env);
      tlb_flush_ppc64(pCVar1);
      break;
    case POWERPC_MMU_BOOKE206:
      booke206_flush_tlb(env,-1,0);
      break;
    default:
      pCVar1 = env_cpu(env);
      cpu_abort_ppc64(pCVar1,"Unknown MMU model %x\n",(ulong)env->mmu_model);
    }
  }
  else {
    env->tlb_need_flush = 0;
    pCVar1 = env_cpu(env);
    tlb_flush_ppc64(pCVar1);
  }
  return;
}

Assistant:

void ppc_tlb_invalidate_all(CPUPPCState *env)
{
#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        env->tlb_need_flush = 0;
        tlb_flush(env_cpu(env));
    } else
#endif /* defined(TARGET_PPC64) */
    switch (env->mmu_model) {
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
        ppc6xx_tlb_invalidate_all(env);
        break;
    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_SOFT_4xx_Z:
        ppc4xx_tlb_invalidate_all(env);
        break;
    case POWERPC_MMU_REAL:
        cpu_abort(env_cpu(env), "No TLB for PowerPC 4xx in real mode\n");
        break;
    case POWERPC_MMU_MPC8xx:
        /* XXX: TODO */
        cpu_abort(env_cpu(env), "MPC8xx MMU model is not implemented\n");
        break;
    case POWERPC_MMU_BOOKE:
        tlb_flush(env_cpu(env));
        break;
    case POWERPC_MMU_BOOKE206:
        booke206_flush_tlb(env, -1, 0);
        break;
    case POWERPC_MMU_32B:
    case POWERPC_MMU_601:
        env->tlb_need_flush = 0;
        tlb_flush(env_cpu(env));
        break;
    default:
        /* XXX: TODO */
        cpu_abort(env_cpu(env), "Unknown MMU model %x\n", env->mmu_model);
        break;
    }
}